

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP4Reader::Init(BP4Reader *this)

{
  long *in_RDI;
  TimePoint timeoutInstant;
  Seconds pollSeconds;
  Seconds timeoutSeconds;
  Seconds *in_stack_000001a8;
  Seconds *in_stack_000001b0;
  TimePoint *in_stack_000001b8;
  BP4Reader *in_stack_000001c0;
  Seconds *in_stack_00000528;
  Seconds *in_stack_00000530;
  TimePoint *in_stack_00000538;
  BP4Reader *in_stack_00000540;
  string *in_stack_00000c08;
  string *in_stack_00000c10;
  Params *in_stack_00000c18;
  BPBase *in_stack_00000c20;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_fffffffffffffe88;
  allocator *__lhs;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  *__lhs_00;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  string *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  duration<double,std::ratio<1l,1l>> local_108 [15];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [32];
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  if ((int)in_RDI[10] != 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"Engine",&local_29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"BP4Reader",&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Init",&local_89);
    std::operator+((char *)in_stack_fffffffffffffed8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  *(undefined1 *)(in_RDI[5] + 200) = 0;
  __lhs_00 = (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
              *)((long)in_RDI + *(long *)(in_RDI[0x18] + -0x20) + 0xc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"in call to BP4::Open to write",&local_d1);
  __lhs = &local_f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"",__lhs);
  adios2::format::BPBase::Init
            (in_stack_00000c20,in_stack_00000c18,in_stack_00000c10,in_stack_00000c08);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  (**(code **)(*in_RDI + 0xb8))();
  helper::RaiseLimitNoFile();
  if ((*(byte *)(in_RDI + 0xed) & 1) != 0) {
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<float,void>
              (local_108,(float *)((long)in_RDI + *(long *)(in_RDI[0x18] + -0x20) + 0x2e4));
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<float,void>
              ((duration<double,std::ratio<1l,1l>> *)&stack0xfffffffffffffef0,
               (float *)((long)in_RDI + *(long *)(in_RDI[0x18] + -0x20) + 0x2e8));
    std::chrono::operator>((duration<double,_std::ratio<1L,_1L>_> *)__lhs,in_stack_fffffffffffffe88)
    ;
    Now();
    std::chrono::operator+(__lhs_00,(duration<double,_std::ratio<1L,_1L>_> *)__lhs);
    OpenFiles(in_stack_00000540,in_stack_00000538,in_stack_00000530,in_stack_00000528);
    if ((*(byte *)((long)in_RDI + *(long *)(in_RDI[0x18] + -0x20) + 0x328) & 1) == 0) {
      std::chrono::operator/((duration<double,_std::ratio<1L,_1L>_> *)__lhs_00,(int *)__lhs);
      InitBuffer(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,in_stack_000001a8);
    }
  }
  return;
}

Assistant:

void BP4Reader::Init()
{
    if (m_OpenMode != Mode::Read)
    {
        helper::Throw<std::invalid_argument>("Engine", "BP4Reader", "Init",
                                             "BPFileReader only "
                                             "supports OpenMode::Read from" +
                                                 m_Name);
    }
    // if IO was involved in reading before this flag may be true now
    m_IO.m_ReadStreaming = false;

    m_BP4Deserializer.Init(m_IO.m_Parameters, "in call to BP4::Open to write");
    InitTransports();

    helper::RaiseLimitNoFile();
    if (readMetadataFromFile)
    {
        /* Do a collective wait for the file(s) to appear within timeout.
           Make sure every process comes to the same conclusion */
        const Seconds timeoutSeconds(m_BP4Deserializer.m_Parameters.OpenTimeoutSecs);

        Seconds pollSeconds(m_BP4Deserializer.m_Parameters.BeginStepPollingFrequencySecs);
        if (pollSeconds > timeoutSeconds)
        {
            pollSeconds = timeoutSeconds;
        }

        TimePoint timeoutInstant = Now() + timeoutSeconds;

        OpenFiles(timeoutInstant, pollSeconds, timeoutSeconds);
        if (!m_BP4Deserializer.m_Parameters.StreamReader)
        {
            /* non-stream reader gets as much steps as available now */
            InitBuffer(timeoutInstant, pollSeconds / 10, timeoutSeconds);
        }
    }
}